

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupEncryptFileFilter.cpp
# Opt level: O3

void __thiscall
GroupEncryptFileFilter::doFilter(GroupEncryptFileFilter *this,ifstream *in,ofstream *out)

{
  int iVar1;
  undefined8 in_RAX;
  char inChar;
  char local_21;
  
  this->charCounter = 0;
  iVar1 = std::istream::peek();
  while (iVar1 != -1) {
    if (this->charCounter < 5) {
      iVar1 = std::istream::peek();
      if ((iVar1 == 0x20) || (iVar1 = std::istream::peek(), iVar1 == 10)) {
        std::istream::get((char *)in);
      }
      else {
        std::istream::get((char *)in);
        local_21 = (char)((ulong)in_RAX >> 0x38);
        (*(this->super_FileFilter)._vptr_FileFilter[1])(this,(ulong)(uint)(int)local_21);
        std::ostream::put((char)out);
        this->charCounter = this->charCounter + 1;
      }
    }
    else {
      std::ostream::put((char)out);
      this->charCounter = 0;
    }
    iVar1 = std::istream::peek();
  }
  return;
}

Assistant:

void GroupEncryptFileFilter::doFilter(std::ifstream &in, std::ofstream &out)
{
    this->charCounter = 0;

    while((in.peek() != EOF))
    {

        char inChar;
        char outChar;

        if(this->charCounter >= 5)
        {
            out.put(' ');
            this->charCounter = 0;
            continue;
        }
        else if(in.peek() == ' ' || in.peek() == '\n')
        {
            //grab the input and throw it away
            in.get(inChar);
            continue;
        }
        else
        {
            in.get(inChar);
            outChar = transform(inChar);
            out.put(outChar);
            this->charCounter++;
        }
    }
}